

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

ExprList * exprListAppendList(Parse *pParse,ExprList *pList,ExprList *pAppend,int bIntToNull)

{
  u8 uVar1;
  sqlite3 *db;
  Expr *p;
  int iVar2;
  Expr *pEVar3;
  long lVar4;
  ExprList_item *pEVar5;
  int iDummy;
  long local_58;
  int local_34;
  
  if (pAppend != (ExprList *)0x0) {
    if (pList == (ExprList *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = (long)pList->nExpr;
    }
    if (0 < pAppend->nExpr) {
      lVar4 = 0;
      do {
        db = pParse->db;
        pEVar3 = pAppend->a[lVar4].pExpr;
        if (pEVar3 == (Expr *)0x0) {
          pEVar3 = (Expr *)0x0;
        }
        else {
          pEVar3 = exprDup(db,pEVar3,0,(EdupBuf *)0x0);
        }
        uVar1 = db->mallocFailed;
        if (uVar1 == '\0') {
          p = pEVar3;
          if (bIntToNull != 0) {
            while ((p != (Expr *)0x0 && ((p->flags & 0x82000) != 0))) {
              if ((p->flags >> 0x13 & 1) == 0) {
                if (p->op != 'q') break;
                pEVar5 = (ExprList_item *)&p->pLeft;
              }
              else {
                pEVar5 = ((p->x).pList)->a;
              }
              p = pEVar5->pExpr;
            }
            iVar2 = sqlite3ExprIsInteger(p,&local_34);
            if (iVar2 != 0) {
              p->op = 'y';
              p->flags = p->flags & 0xcffff7ff;
              (p->u).zToken = (char *)0x0;
            }
          }
          pList = sqlite3ExprListAppend(pParse,pList,pEVar3);
          if (pList != (ExprList *)0x0) {
            pList->a[local_58 + lVar4].fg.sortFlags = pAppend->a[lVar4].fg.sortFlags;
          }
        }
        else if (pEVar3 != (Expr *)0x0) {
          sqlite3ExprDeleteNN(db,pEVar3);
        }
      } while ((uVar1 == '\0') && (lVar4 = lVar4 + 1, lVar4 < pAppend->nExpr));
    }
  }
  return pList;
}

Assistant:

static ExprList *exprListAppendList(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  ExprList *pAppend,      /* List of values to append. Might be NULL */
  int bIntToNull
){
  if( pAppend ){
    int i;
    int nInit = pList ? pList->nExpr : 0;
    for(i=0; i<pAppend->nExpr; i++){
      sqlite3 *db = pParse->db;
      Expr *pDup = sqlite3ExprDup(db, pAppend->a[i].pExpr, 0);
      if( db->mallocFailed ){
        sqlite3ExprDelete(db, pDup);
        break;
      }
      if( bIntToNull ){
        int iDummy;
        Expr *pSub;
        pSub = sqlite3ExprSkipCollateAndLikely(pDup);
        if( sqlite3ExprIsInteger(pSub, &iDummy) ){
          pSub->op = TK_NULL;
          pSub->flags &= ~(EP_IntValue|EP_IsTrue|EP_IsFalse);
          pSub->u.zToken = 0;
        }
      }
      pList = sqlite3ExprListAppend(pParse, pList, pDup);
      if( pList ) pList->a[nInit+i].fg.sortFlags = pAppend->a[i].fg.sortFlags;
    }
  }
  return pList;
}